

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O1

void __thiscall UniValue::pushKV(UniValue *this,string key,UniValue val)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string key_00;
  UniValue val_00;
  bool bVar12;
  undefined4 *in_RDX;
  string *in_RSI;
  long in_FS_OFFSET;
  size_t idx;
  VType VVar13;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  long *plVar14;
  long lVar15;
  undefined8 in_stack_ffffffffffffff80;
  pointer pcVar16;
  pointer pUVar17;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  VVar13 = VOBJ;
  checkType(this,(VType *)&stack0xffffffffffffff58);
  bVar12 = findKey(this,in_RSI,(size_t *)&stack0xffffffffffffff58);
  if (bVar12) {
    pushKV();
  }
  else {
    pcVar16 = (in_RSI->_M_dataplus)._M_p;
    paVar1 = &in_RSI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16 == paVar1) {
      pUVar17 = (pointer)paVar1->_M_allocated_capacity;
      pcVar16 = &stack0xffffffffffffffc8;
    }
    else {
      pUVar17 = (pointer)paVar1->_M_allocated_capacity;
    }
    sVar4 = in_RSI->_M_string_length;
    (in_RSI->_M_dataplus)._M_p = (pointer)paVar1;
    in_RSI->_M_string_length = 0;
    (in_RSI->field_2)._M_local_buf[0] = '\0';
    plVar2 = (long *)(in_RDX + 6);
    if (*(long **)(in_RDX + 2) == plVar2) {
      lVar15 = *plVar2;
      in_stack_ffffffffffffff80 = *(undefined8 *)(in_RDX + 8);
      plVar14 = (long *)&stack0xffffffffffffff78;
    }
    else {
      lVar15 = *plVar2;
      plVar14 = *(long **)(in_RDX + 2);
    }
    uVar5 = *(undefined8 *)(in_RDX + 4);
    *(long **)(in_RDX + 2) = plVar2;
    *(undefined8 *)(in_RDX + 4) = 0;
    *(undefined1 *)(in_RDX + 6) = 0;
    uVar8 = *(undefined8 *)(in_RDX + 10);
    uVar9 = *(undefined8 *)(in_RDX + 0xc);
    uVar6 = *(undefined8 *)(in_RDX + 0xe);
    *(undefined8 *)(in_RDX + 0xe) = 0;
    *(undefined8 *)(in_RDX + 10) = 0;
    *(undefined8 *)(in_RDX + 0xc) = 0;
    uVar10 = *(undefined8 *)(in_RDX + 0x10);
    uVar11 = *(undefined8 *)(in_RDX + 0x12);
    uVar7 = *(undefined8 *)(in_RDX + 0x14);
    *(undefined8 *)(in_RDX + 0x14) = 0;
    *(undefined8 *)(in_RDX + 0x10) = 0;
    *(undefined8 *)(in_RDX + 0x12) = 0;
    key_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffff5c;
    key_00._M_dataplus._M_p._0_4_ = VVar13;
    key_00._M_string_length._0_4_ = *in_RDX;
    key_00._M_string_length._4_4_ = in_stack_ffffffffffffff64;
    key_00.field_2._M_allocated_capacity = (size_type)plVar14;
    key_00.field_2._8_8_ = uVar5;
    val_00.val._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff80;
    val_00._0_8_ = lVar15;
    val_00.val._M_string_length = uVar8;
    val_00.val.field_2._M_allocated_capacity = uVar9;
    val_00.val.field_2._8_8_ = uVar6;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar10;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar11;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar7;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pcVar16;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)sVar4;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pUVar17;
    pushKVEnd(this,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xffffffffffffffa0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff88);
    if (plVar14 != (long *)&stack0xffffffffffffff78) {
      operator_delete(plVar14,lVar15 + 1);
    }
    if (pcVar16 != &stack0xffffffffffffffc8) {
      operator_delete(pcVar16,(ulong)((long)&pUVar17->typ + 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::pushKV(std::string key, UniValue val)
{
    checkType(VOBJ);

    size_t idx;
    if (findKey(key, idx))
        values[idx] = std::move(val);
    else
        pushKVEnd(std::move(key), std::move(val));
}